

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toymodule.cpp
# Opt level: O2

int init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ostream *poVar2;
  UinputDevice *this;
  initializer_list<unsigned_int> __l;
  initializer_list<UinputDevice::PossibleEvent> __l_00;
  allocator_type local_b0;
  allocator_type local_af;
  allocator local_ae;
  allocator local_ad;
  uint local_ac;
  _Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  local_a8;
  PossibleEvent local_88;
  vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_> local_68;
  string local_50;
  string local_30;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Init!");
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (UinputDevice *)operator_new(4);
  std::__cxx11::string::string((string *)&local_30,"/dev/uinput",&local_ad);
  std::__cxx11::string::string((string *)&local_50,"FunKeyMonkey Toy",&local_ae);
  local_88.type = 1;
  local_ac = 0x25;
  __l._M_len = 1;
  __l._M_array = &local_ac;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88.codes,__l,&local_af);
  __l_00._M_len = 1;
  __l_00._M_array = &local_88;
  std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::vector
            (&local_68,__l_00,&local_b0);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UinputDevice::UinputDevice
            (this,&local_30,3,&local_50,1,1,1,&local_68,
             (vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
              *)&local_a8);
  out = this;
  std::
  _Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ::~_Vector_base(&local_a8);
  std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::~vector
            (&local_68);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_88.codes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__cxx11::string::~string((string *)&local_50);
  iVar1 = std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

void init(char const** argv, unsigned int argc)
{
  std::cout << "Init!" << std::endl;
  out = new UinputDevice("/dev/uinput", BUS_USB, "FunKeyMonkey Toy", 1, 1, 1, {
    { EV_KEY, { KEY_K } }
  });
}